

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::IntersectConstraints
          (LoopDependenceAnalysis *this,Constraint *constraint_0,Constraint *constraint_1,
          SENode *lower_bound,SENode *upper_bound)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SENode *pSVar3;
  SENode *pSVar4;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  long lVar5;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  SEConstantNode *this_00;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  DependencePoint *this_01;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  SENode *pSVar6;
  undefined4 extraout_var_50;
  SENode *pSVar7;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  int64_t iVar8;
  undefined4 extraout_var_57;
  int64_t iVar9;
  undefined4 extraout_var_58;
  int64_t iVar10;
  undefined4 extraout_var_59;
  int64_t iVar11;
  undefined4 extraout_var_60;
  int64_t iVar12;
  LoopDependenceAnalysis *local_240;
  SENode *local_228;
  SENode *local_210;
  SENode *local_1f0;
  SENode *local_1e8;
  SENode *local_1e0;
  SENode *local_1c8;
  SENode *local_1c0;
  SENode *local_1b8;
  int64_t left_hand_side;
  int64_t constant_y;
  int64_t constant_x;
  int64_t constant_c;
  int64_t constant_b;
  int64_t constant_a;
  SENode *y;
  SENode *x;
  SENode *c;
  SENode *b;
  SENode *a;
  bool is_distance;
  Constraint *line_or_distance;
  DependencePoint *point;
  Loop *pLStack_118;
  bool point_0_1;
  SENode *local_110;
  SENode *local_108;
  long local_100;
  int64_t const_b_to_use;
  int64_t arg1;
  int64_t y_coord;
  int64_t x_coord;
  int64_t down;
  int64_t up;
  int64_t constant_upper_bound;
  int64_t constant_lower_bound;
  int64_t constant_c1;
  int64_t constant_b1;
  int64_t constant_a1;
  int64_t constant_c0;
  int64_t constant_b0;
  int64_t constant_a0;
  SENode *c1;
  SENode *b1;
  SENode *a1;
  SENode *c0;
  SENode *b0;
  SENode *a0;
  bool is_distance_1;
  DependencePoint *pDStack_58;
  bool is_distance_0;
  DependencePoint *point_1;
  DependencePoint *point_0;
  DependenceDistance *dist_1;
  DependenceDistance *dist_0;
  SENode *upper_bound_local;
  SENode *lower_bound_local;
  Constraint *constraint_1_local;
  Constraint *constraint_0_local;
  LoopDependenceAnalysis *this_local;
  undefined4 extraout_var_44;
  
  dist_0 = (DependenceDistance *)upper_bound;
  upper_bound_local = lower_bound;
  lower_bound_local = (SENode *)constraint_1;
  constraint_1_local = constraint_0;
  constraint_0_local = (Constraint *)this;
  iVar2 = (*constraint_0->_vptr_Constraint[9])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*lower_bound_local->_vptr_SENode[9])();
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      iVar2 = (*constraint_1_local->_vptr_Constraint[5])();
      if ((CONCAT44(extraout_var_01,iVar2) == 0) ||
         (iVar2 = (*lower_bound_local->_vptr_SENode[5])(), CONCAT44(extraout_var_02,iVar2) == 0)) {
        iVar2 = (*constraint_1_local->_vptr_Constraint[7])();
        if ((CONCAT44(extraout_var_05,iVar2) == 0) ||
           (iVar2 = (*lower_bound_local->_vptr_SENode[7])(), CONCAT44(extraout_var_06,iVar2) == 0))
        {
          iVar2 = (*constraint_1_local->_vptr_Constraint[5])();
          if (((CONCAT44(extraout_var_09,iVar2) == 0) &&
              (iVar2 = (*constraint_1_local->_vptr_Constraint[3])(),
              CONCAT44(extraout_var_10,iVar2) == 0)) ||
             ((iVar2 = (*lower_bound_local->_vptr_SENode[5])(), CONCAT44(extraout_var_11,iVar2) == 0
              && (iVar2 = (*lower_bound_local->_vptr_SENode[3])(),
                 CONCAT44(extraout_var_12,iVar2) == 0)))) {
            iVar2 = (*constraint_1_local->_vptr_Constraint[7])();
            if (((CONCAT44(extraout_var_37,iVar2) == 0) ||
                ((iVar2 = (*lower_bound_local->_vptr_SENode[3])(),
                 CONCAT44(extraout_var_38,iVar2) == 0 &&
                 (iVar2 = (*lower_bound_local->_vptr_SENode[5])(),
                 CONCAT44(extraout_var_39,iVar2) == 0)))) &&
               ((iVar2 = (*lower_bound_local->_vptr_SENode[7])(),
                CONCAT44(extraout_var_40,iVar2) == 0 ||
                ((iVar2 = (*constraint_1_local->_vptr_Constraint[3])(),
                 CONCAT44(extraout_var_41,iVar2) == 0 &&
                 (iVar2 = (*constraint_1_local->_vptr_Constraint[5])(),
                 CONCAT44(extraout_var_42,iVar2) == 0)))))) {
              this_local = (LoopDependenceAnalysis *)0x0;
            }
            else {
              iVar2 = (*constraint_1_local->_vptr_Constraint[7])();
              bVar1 = CONCAT44(extraout_var_43,iVar2) == 0;
              if (bVar1) {
                iVar2 = (*lower_bound_local->_vptr_SENode[7])();
                this_01 = (DependencePoint *)CONCAT44(extraout_var_45,iVar2);
                local_210 = (SENode *)constraint_1_local;
              }
              else {
                iVar2 = (*constraint_1_local->_vptr_Constraint[7])();
                this_01 = (DependencePoint *)CONCAT44(extraout_var_44,iVar2);
                local_210 = lower_bound_local;
              }
              iVar2 = (*local_210->_vptr_SENode[5])();
              if (CONCAT44(extraout_var_46,iVar2) == 0) {
                iVar2 = (*local_210->_vptr_SENode[3])();
                pSVar3 = DependenceLine::GetA((DependenceLine *)CONCAT44(extraout_var_47,iVar2));
                iVar2 = (*local_210->_vptr_SENode[3])();
                pSVar4 = DependenceLine::GetB((DependenceLine *)CONCAT44(extraout_var_48,iVar2));
                iVar2 = (*local_210->_vptr_SENode[3])();
                local_228 = DependenceLine::GetC((DependenceLine *)CONCAT44(extraout_var_50,iVar2));
              }
              else {
                pSVar3 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
                pSVar4 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
                iVar2 = (*local_210->_vptr_SENode[5])();
                pSVar6 = DependenceDistance::GetDistance
                                   ((DependenceDistance *)CONCAT44(extraout_var_49,iVar2));
                pSVar6 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar6);
                local_228 = ScalarEvolutionAnalysis::SimplifyExpression
                                      (&this->scalar_evolution_,pSVar6);
              }
              pSVar6 = DependencePoint::GetSource(this_01);
              pSVar7 = DependencePoint::GetDestination(this_01);
              iVar2 = (*pSVar3->_vptr_SENode[4])();
              if ((((CONCAT44(extraout_var_51,iVar2) == 0) ||
                   (iVar2 = (*pSVar4->_vptr_SENode[4])(), CONCAT44(extraout_var_52,iVar2) == 0)) ||
                  (iVar2 = (*local_228->_vptr_SENode[4])(), CONCAT44(extraout_var_53,iVar2) == 0))
                 || ((iVar2 = (*pSVar6->_vptr_SENode[4])(), CONCAT44(extraout_var_54,iVar2) == 0 ||
                     (iVar2 = (*pSVar7->_vptr_SENode[4])(), CONCAT44(extraout_var_55,iVar2) == 0))))
              {
                this_local = (LoopDependenceAnalysis *)
                             make_constraint<spvtools::opt::DependenceNone>(this);
              }
              else {
                iVar2 = (*pSVar3->_vptr_SENode[4])();
                iVar8 = SEConstantNode::FoldToSingleValue
                                  ((SEConstantNode *)CONCAT44(extraout_var_56,iVar2));
                iVar2 = (*pSVar4->_vptr_SENode[4])();
                iVar9 = SEConstantNode::FoldToSingleValue
                                  ((SEConstantNode *)CONCAT44(extraout_var_57,iVar2));
                iVar2 = (*local_228->_vptr_SENode[4])();
                iVar10 = SEConstantNode::FoldToSingleValue
                                   ((SEConstantNode *)CONCAT44(extraout_var_58,iVar2));
                iVar2 = (*pSVar6->_vptr_SENode[4])();
                iVar11 = SEConstantNode::FoldToSingleValue
                                   ((SEConstantNode *)CONCAT44(extraout_var_59,iVar2));
                iVar2 = (*pSVar7->_vptr_SENode[4])();
                iVar12 = SEConstantNode::FoldToSingleValue
                                   ((SEConstantNode *)CONCAT44(extraout_var_60,iVar2));
                if (iVar8 * iVar11 + iVar9 * iVar12 == iVar10) {
                  if (bVar1) {
                    local_240 = (LoopDependenceAnalysis *)lower_bound_local;
                  }
                  else {
                    local_240 = (LoopDependenceAnalysis *)constraint_1_local;
                  }
                  this_local = local_240;
                }
                else {
                  this_local = (LoopDependenceAnalysis *)
                               make_constraint<spvtools::opt::DependenceEmpty>(this);
                }
              }
            }
          }
          else {
            iVar2 = (*constraint_1_local->_vptr_Constraint[5])();
            a0._7_1_ = CONCAT44(extraout_var_13,iVar2) != 0;
            iVar2 = (*lower_bound_local->_vptr_SENode[5])();
            a0._6_1_ = CONCAT44(extraout_var_14,iVar2) != 0;
            if ((a0._7_1_ & 1) == 0) {
              iVar2 = (*constraint_1_local->_vptr_Constraint[3])();
              local_1b8 = DependenceLine::GetA((DependenceLine *)CONCAT44(extraout_var_15,iVar2));
            }
            else {
              local_1b8 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
            }
            b0 = local_1b8;
            if ((a0._7_1_ & 1) == 0) {
              iVar2 = (*constraint_1_local->_vptr_Constraint[3])();
              local_1c0 = DependenceLine::GetB((DependenceLine *)CONCAT44(extraout_var_16,iVar2));
            }
            else {
              local_1c0 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
            }
            c0 = local_1c0;
            if ((a0._7_1_ & 1) == 0) {
              iVar2 = (*constraint_1_local->_vptr_Constraint[3])();
              local_1c8 = DependenceLine::GetC((DependenceLine *)CONCAT44(extraout_var_18,iVar2));
            }
            else {
              iVar2 = (*constraint_1_local->_vptr_Constraint[5])();
              pSVar3 = DependenceDistance::GetDistance
                                 ((DependenceDistance *)CONCAT44(extraout_var_17,iVar2));
              pSVar3 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar3);
              local_1c8 = ScalarEvolutionAnalysis::SimplifyExpression
                                    (&this->scalar_evolution_,pSVar3);
            }
            a1 = local_1c8;
            if ((a0._6_1_ & 1) == 0) {
              iVar2 = (*lower_bound_local->_vptr_SENode[3])();
              local_1e0 = DependenceLine::GetA((DependenceLine *)CONCAT44(extraout_var_19,iVar2));
            }
            else {
              local_1e0 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
            }
            b1 = local_1e0;
            if ((a0._6_1_ & 1) == 0) {
              iVar2 = (*lower_bound_local->_vptr_SENode[3])();
              local_1e8 = DependenceLine::GetB((DependenceLine *)CONCAT44(extraout_var_20,iVar2));
            }
            else {
              local_1e8 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
            }
            c1 = local_1e8;
            if ((a0._6_1_ & 1) == 0) {
              iVar2 = (*lower_bound_local->_vptr_SENode[3])();
              local_1f0 = DependenceLine::GetC((DependenceLine *)CONCAT44(extraout_var_22,iVar2));
            }
            else {
              iVar2 = (*lower_bound_local->_vptr_SENode[5])();
              pSVar3 = DependenceDistance::GetDistance
                                 ((DependenceDistance *)CONCAT44(extraout_var_21,iVar2));
              pSVar3 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar3);
              local_1f0 = ScalarEvolutionAnalysis::SimplifyExpression
                                    (&this->scalar_evolution_,pSVar3);
            }
            constant_a0 = (int64_t)local_1f0;
            iVar2 = (*b0->_vptr_SENode[4])();
            if (((CONCAT44(extraout_var_23,iVar2) == 0) ||
                (iVar2 = (*c0->_vptr_SENode[4])(), CONCAT44(extraout_var_24,iVar2) == 0)) ||
               ((iVar2 = (*a1->_vptr_SENode[4])(), CONCAT44(extraout_var_25,iVar2) == 0 ||
                (((iVar2 = (*b1->_vptr_SENode[4])(), CONCAT44(extraout_var_26,iVar2) == 0 ||
                  (iVar2 = (*c1->_vptr_SENode[4])(), CONCAT44(extraout_var_27,iVar2) == 0)) ||
                 (lVar5 = (**(code **)(*(long *)constant_a0 + 0x20))(), lVar5 == 0)))))) {
              this_local = (LoopDependenceAnalysis *)
                           make_constraint<spvtools::opt::DependenceNone>(this);
            }
            else {
              iVar2 = (*b0->_vptr_SENode[4])();
              constant_b0 = SEConstantNode::FoldToSingleValue
                                      ((SEConstantNode *)CONCAT44(extraout_var_28,iVar2));
              iVar2 = (*c0->_vptr_SENode[4])();
              constant_c0 = SEConstantNode::FoldToSingleValue
                                      ((SEConstantNode *)CONCAT44(extraout_var_29,iVar2));
              iVar2 = (*a1->_vptr_SENode[4])();
              constant_a1 = SEConstantNode::FoldToSingleValue
                                      ((SEConstantNode *)CONCAT44(extraout_var_30,iVar2));
              iVar2 = (*b1->_vptr_SENode[4])();
              constant_b1 = SEConstantNode::FoldToSingleValue
                                      ((SEConstantNode *)CONCAT44(extraout_var_31,iVar2));
              iVar2 = (*c1->_vptr_SENode[4])();
              constant_c1 = SEConstantNode::FoldToSingleValue
                                      ((SEConstantNode *)CONCAT44(extraout_var_32,iVar2));
              this_00 = (SEConstantNode *)(**(code **)(*(long *)constant_a0 + 0x20))();
              constant_lower_bound = SEConstantNode::FoldToSingleValue(this_00);
              bVar1 = anon_unknown_15::NormalizeAndCompareFractions
                                (constant_b0,constant_c0,constant_b1,constant_c1);
              if (bVar1) {
                if ((constant_c0 == 0) && (constant_c1 == 0)) {
                  bVar1 = anon_unknown_15::NormalizeAndCompareFractions
                                    (constant_a1,constant_b0,constant_lower_bound,constant_b1);
                  if (bVar1) {
                    this_local = (LoopDependenceAnalysis *)constraint_1_local;
                  }
                  else {
                    this_local = (LoopDependenceAnalysis *)
                                 make_constraint<spvtools::opt::DependenceEmpty>(this);
                  }
                }
                else {
                  bVar1 = anon_unknown_15::NormalizeAndCompareFractions
                                    (constant_a1,constant_c0,constant_lower_bound,constant_c1);
                  if (bVar1) {
                    this_local = (LoopDependenceAnalysis *)constraint_1_local;
                  }
                  else {
                    this_local = (LoopDependenceAnalysis *)
                                 make_constraint<spvtools::opt::DependenceEmpty>(this);
                  }
                }
              }
              else {
                iVar2 = (*(dist_0->super_Constraint)._vptr_Constraint[5])();
                if ((CONCAT44(extraout_var_33,iVar2) == 0) ||
                   (iVar2 = (*upper_bound_local->_vptr_SENode[5])(),
                   CONCAT44(extraout_var_34,iVar2) == 0)) {
                  this_local = (LoopDependenceAnalysis *)
                               make_constraint<spvtools::opt::DependenceNone>(this);
                }
                else {
                  iVar2 = (*upper_bound_local->_vptr_SENode[5])();
                  constant_upper_bound =
                       SEConstantNode::FoldToSingleValue
                                 ((SEConstantNode *)CONCAT44(extraout_var_35,iVar2));
                  iVar2 = (*(dist_0->super_Constraint)._vptr_Constraint[5])();
                  up = SEConstantNode::FoldToSingleValue
                                 ((SEConstantNode *)CONCAT44(extraout_var_36,iVar2));
                  down = constant_c1 * constant_a1 - constant_c0 * constant_lower_bound;
                  x_coord = constant_c1 * constant_b0 - constant_c0 * constant_b1;
                  y_coord = down / x_coord;
                  arg1 = 0;
                  const_b_to_use = 0;
                  local_100 = 0;
                  if (constant_c1 == 0) {
                    if (constant_c0 != 0) {
                      const_b_to_use = constant_a1 - constant_b0 * y_coord;
                      arg1 = const_b_to_use / constant_c0;
                      local_100 = constant_c0;
                    }
                  }
                  else {
                    const_b_to_use = constant_lower_bound - constant_b1 * y_coord;
                    arg1 = const_b_to_use / constant_c1;
                    local_100 = constant_c1;
                  }
                  if (((((down % x_coord == 0) && (const_b_to_use % local_100 == 0)) &&
                       (constant_upper_bound <= y_coord)) &&
                      ((y_coord <= up && (constant_upper_bound <= arg1)))) && (arg1 <= up)) {
                    local_108 = ScalarEvolutionAnalysis::CreateConstant
                                          (&this->scalar_evolution_,y_coord);
                    local_110 = ScalarEvolutionAnalysis::CreateConstant
                                          (&this->scalar_evolution_,arg1);
                    pLStack_118 = Constraint::GetLoop(constraint_1_local);
                    this_local = (LoopDependenceAnalysis *)
                                 make_constraint<spvtools::opt::DependencePoint,spvtools::opt::SENode*,spvtools::opt::SENode*,spvtools::opt::Loop_const*>
                                           (this,&local_108,&local_110,&stack0xfffffffffffffee8);
                  }
                  else {
                    this_local = (LoopDependenceAnalysis *)
                                 make_constraint<spvtools::opt::DependenceEmpty>(this);
                  }
                }
              }
            }
          }
        }
        else {
          iVar2 = (*constraint_1_local->_vptr_Constraint[7])();
          point_1 = (DependencePoint *)CONCAT44(extraout_var_07,iVar2);
          iVar2 = (*lower_bound_local->_vptr_SENode[7])();
          pDStack_58 = (DependencePoint *)CONCAT44(extraout_var_08,iVar2);
          pSVar3 = DependencePoint::GetSource(point_1);
          pSVar4 = DependencePoint::GetSource(pDStack_58);
          bVar1 = SENode::operator==(pSVar3,pSVar4);
          if (bVar1) {
            pSVar3 = DependencePoint::GetDestination(point_1);
            pSVar4 = DependencePoint::GetDestination(pDStack_58);
            bVar1 = SENode::operator==(pSVar3,pSVar4);
            if (bVar1) {
              return constraint_1_local;
            }
          }
          this_local = (LoopDependenceAnalysis *)
                       make_constraint<spvtools::opt::DependenceEmpty>(this);
        }
      }
      else {
        iVar2 = (*constraint_1_local->_vptr_Constraint[5])();
        dist_1 = (DependenceDistance *)CONCAT44(extraout_var_03,iVar2);
        iVar2 = (*lower_bound_local->_vptr_SENode[5])();
        point_0 = (DependencePoint *)CONCAT44(extraout_var_04,iVar2);
        pSVar3 = DependenceDistance::GetDistance(dist_1);
        pSVar4 = DependenceDistance::GetDistance((DependenceDistance *)point_0);
        bVar1 = SENode::operator==(pSVar3,pSVar4);
        if (bVar1) {
          this_local = (LoopDependenceAnalysis *)constraint_1_local;
        }
        else {
          this_local = (LoopDependenceAnalysis *)
                       make_constraint<spvtools::opt::DependenceEmpty>(this);
        }
      }
    }
    else {
      this_local = (LoopDependenceAnalysis *)constraint_1_local;
    }
  }
  else {
    this_local = (LoopDependenceAnalysis *)lower_bound_local;
  }
  return (Constraint *)this_local;
}

Assistant:

Constraint* LoopDependenceAnalysis::IntersectConstraints(
    Constraint* constraint_0, Constraint* constraint_1,
    const SENode* lower_bound, const SENode* upper_bound) {
  if (constraint_0->AsDependenceNone()) {
    return constraint_1;
  } else if (constraint_1->AsDependenceNone()) {
    return constraint_0;
  }

  // Both constraints are distances. Either the same distance or independent.
  if (constraint_0->AsDependenceDistance() &&
      constraint_1->AsDependenceDistance()) {
    auto dist_0 = constraint_0->AsDependenceDistance();
    auto dist_1 = constraint_1->AsDependenceDistance();

    if (*dist_0->GetDistance() == *dist_1->GetDistance()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are points. Either the same point or independent.
  if (constraint_0->AsDependencePoint() && constraint_1->AsDependencePoint()) {
    auto point_0 = constraint_0->AsDependencePoint();
    auto point_1 = constraint_1->AsDependencePoint();

    if (*point_0->GetSource() == *point_1->GetSource() &&
        *point_0->GetDestination() == *point_1->GetDestination()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are lines/distances.
  if ((constraint_0->AsDependenceDistance() ||
       constraint_0->AsDependenceLine()) &&
      (constraint_1->AsDependenceDistance() ||
       constraint_1->AsDependenceLine())) {
    auto is_distance_0 = constraint_0->AsDependenceDistance() != nullptr;
    auto is_distance_1 = constraint_1->AsDependenceDistance() != nullptr;

    auto a0 = is_distance_0 ? scalar_evolution_.CreateConstant(1)
                            : constraint_0->AsDependenceLine()->GetA();
    auto b0 = is_distance_0 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_0->AsDependenceLine()->GetB();
    auto c0 =
        is_distance_0
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_0->AsDependenceDistance()->GetDistance()))
            : constraint_0->AsDependenceLine()->GetC();

    auto a1 = is_distance_1 ? scalar_evolution_.CreateConstant(1)
                            : constraint_1->AsDependenceLine()->GetA();
    auto b1 = is_distance_1 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_1->AsDependenceLine()->GetB();
    auto c1 =
        is_distance_1
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_1->AsDependenceDistance()->GetDistance()))
            : constraint_1->AsDependenceLine()->GetC();

    if (a0->AsSEConstantNode() && b0->AsSEConstantNode() &&
        c0->AsSEConstantNode() && a1->AsSEConstantNode() &&
        b1->AsSEConstantNode() && c1->AsSEConstantNode()) {
      auto constant_a0 = a0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b0 = b0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c0 = c0->AsSEConstantNode()->FoldToSingleValue();

      auto constant_a1 = a1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b1 = b1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c1 = c1->AsSEConstantNode()->FoldToSingleValue();

      // a & b can't both be zero, otherwise it wouldn't be line.
      if (NormalizeAndCompareFractions(constant_a0, constant_b0, constant_a1,
                                       constant_b1)) {
        // Slopes are equal, either parallel lines or the same line.

        if (constant_b0 == 0 && constant_b1 == 0) {
          if (NormalizeAndCompareFractions(constant_c0, constant_a0,
                                           constant_c1, constant_a1)) {
            return constraint_0;
          }

          return make_constraint<DependenceEmpty>();
        } else if (NormalizeAndCompareFractions(constant_c0, constant_b0,
                                                constant_c1, constant_b1)) {
          // Same line.
          return constraint_0;
        } else {
          // Parallel lines can't intersect, report independence.
          return make_constraint<DependenceEmpty>();
        }

      } else {
        // Lines are not parallel, therefore, they must intersect.

        // Calculate intersection.
        if (upper_bound->AsSEConstantNode() &&
            lower_bound->AsSEConstantNode()) {
          auto constant_lower_bound =
              lower_bound->AsSEConstantNode()->FoldToSingleValue();
          auto constant_upper_bound =
              upper_bound->AsSEConstantNode()->FoldToSingleValue();

          auto up = constant_b1 * constant_c0 - constant_b0 * constant_c1;
          // Both b or both a can't be 0, so down is never 0
          // otherwise would have entered the parallel line section.
          auto down = constant_b1 * constant_a0 - constant_b0 * constant_a1;

          auto x_coord = up / down;

          int64_t y_coord = 0;
          int64_t arg1 = 0;
          int64_t const_b_to_use = 0;

          if (constant_b1 != 0) {
            arg1 = constant_c1 - constant_a1 * x_coord;
            y_coord = arg1 / constant_b1;
            const_b_to_use = constant_b1;
          } else if (constant_b0 != 0) {
            arg1 = constant_c0 - constant_a0 * x_coord;
            y_coord = arg1 / constant_b0;
            const_b_to_use = constant_b0;
          }

          if (up % down == 0 &&
              arg1 % const_b_to_use == 0 &&  // Coordinates are integers.
              constant_lower_bound <=
                  x_coord &&  // x_coord is within loop bounds.
              x_coord <= constant_upper_bound &&
              constant_lower_bound <=
                  y_coord &&  // y_coord is within loop bounds.
              y_coord <= constant_upper_bound) {
            // Lines intersect at integer coordinates.
            return make_constraint<DependencePoint>(
                scalar_evolution_.CreateConstant(x_coord),
                scalar_evolution_.CreateConstant(y_coord),
                constraint_0->GetLoop());

          } else {
            return make_constraint<DependenceEmpty>();
          }

        } else {
          // Not constants, bail out.
          return make_constraint<DependenceNone>();
        }
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  // One constraint is a line/distance and the other is a point.
  if ((constraint_0->AsDependencePoint() &&
       (constraint_1->AsDependenceLine() ||
        constraint_1->AsDependenceDistance())) ||
      (constraint_1->AsDependencePoint() &&
       (constraint_0->AsDependenceLine() ||
        constraint_0->AsDependenceDistance()))) {
    auto point_0 = constraint_0->AsDependencePoint() != nullptr;

    auto point = point_0 ? constraint_0->AsDependencePoint()
                         : constraint_1->AsDependencePoint();

    auto line_or_distance = point_0 ? constraint_1 : constraint_0;

    auto is_distance = line_or_distance->AsDependenceDistance() != nullptr;

    auto a = is_distance ? scalar_evolution_.CreateConstant(1)
                         : line_or_distance->AsDependenceLine()->GetA();
    auto b = is_distance ? scalar_evolution_.CreateConstant(-1)
                         : line_or_distance->AsDependenceLine()->GetB();
    auto c =
        is_distance
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      line_or_distance->AsDependenceDistance()->GetDistance()))
            : line_or_distance->AsDependenceLine()->GetC();

    auto x = point->GetSource();
    auto y = point->GetDestination();

    if (a->AsSEConstantNode() && b->AsSEConstantNode() &&
        c->AsSEConstantNode() && x->AsSEConstantNode() &&
        y->AsSEConstantNode()) {
      auto constant_a = a->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b = b->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c = c->AsSEConstantNode()->FoldToSingleValue();

      auto constant_x = x->AsSEConstantNode()->FoldToSingleValue();
      auto constant_y = y->AsSEConstantNode()->FoldToSingleValue();

      auto left_hand_side = constant_a * constant_x + constant_b * constant_y;

      if (left_hand_side == constant_c) {
        // Point is on line, return point
        return point_0 ? constraint_0 : constraint_1;
      } else {
        // Point not on line, report independence (empty constraint).
        return make_constraint<DependenceEmpty>();
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  return nullptr;
}